

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O3

UBool __thiscall
icu_63::NumeratorSubstitution::doParse
          (NumeratorSubstitution *this,UnicodeString *text,ParsePosition *parsePosition,
          double baseValue,double upperBound,UBool param_5,uint32_t nonNumericalExecutedRuleMask,
          Formattable *result)

{
  undefined2 uVar1;
  ushort uVar2;
  undefined4 uVar3;
  uint uVar4;
  int32_t iVar5;
  ushort uVar6;
  uint uVar7;
  long lVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  int iVar11;
  double baseValue_00;
  ParsePosition workPos;
  UErrorCode status;
  UnicodeString workText;
  Formattable temp;
  ParsePosition local_118;
  UErrorCode local_104;
  double local_100;
  double local_f8;
  UnicodeString local_f0;
  UnicodeString *local_b0;
  Formattable *local_a8;
  Formattable local_a0;
  
  local_104 = U_ZERO_ERROR;
  local_100 = baseValue;
  local_f8 = upperBound;
  UnicodeString::UnicodeString(&local_f0,text);
  if (this->withZeros == '\0') {
    iVar11 = 0;
    baseValue_00 = local_100;
  }
  else {
    local_118.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003ab3a0;
    local_118.index = 1;
    local_118.errorIndex = -1;
    Formattable::Formattable(&local_a0);
    uVar3 = local_f0.fUnion.fFields.fLength;
    if (-1 < local_f0.fUnion.fStackFields.fLengthAndFlags) {
      uVar3 = (int)local_f0.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    iVar11 = 0;
    local_b0 = text;
    local_a8 = result;
    if ((0 < (int)uVar3) && (iVar11 = 0, local_118.index != 0)) {
      iVar11 = 0;
      while( true ) {
        local_118._8_8_ = local_118._8_8_ & 0xffffffff00000000;
        NFRuleSet::parse((this->super_NFSubstitution).ruleSet,&local_f0,&local_118,1.0,
                         nonNumericalExecutedRuleMask,&local_a0);
        if (local_118.index == 0) break;
        parsePosition->index = parsePosition->index + local_118.index;
        if (local_118.index == 0x7fffffff) {
          uVar4 = (ushort)local_f0.fUnion.fStackFields.fLengthAndFlags & 0x1e;
          if ((local_f0.fUnion.fStackFields.fLengthAndFlags & 1U) != 0) {
            uVar4 = 2;
          }
          local_f0.fUnion.fStackFields.fLengthAndFlags = (int16_t)uVar4;
        }
        else {
          UnicodeString::doReplace(&local_f0,0,local_118.index,(UChar *)0x0,0,0);
          uVar4 = (uint)(ushort)local_f0.fUnion.fStackFields.fLengthAndFlags;
        }
        uVar7 = (uint)(short)(ushort)uVar4;
        uVar1 = (ushort)uVar4;
        while( true ) {
          uVar9 = (int)uVar7 >> 5;
          uVar3 = uVar9;
          if ((short)uVar1 < 0) {
            uVar3 = local_f0.fUnion.fFields.fLength;
          }
          if ((int)uVar3 < 1) goto LAB_0025218d;
          uVar10 = local_f0.fUnion.fStackFields.fBuffer;
          if ((uVar4 & 2) == 0) {
            uVar10 = local_f0.fUnion.fFields.fArray;
          }
          if (*(char16_t *)uVar10 != L' ') break;
          UnicodeString::doReplace(&local_f0,0,1,(UChar *)0x0,0,0);
          parsePosition->index = parsePosition->index + 1;
          uVar7 = (uint)local_f0.fUnion.fStackFields.fLengthAndFlags;
          uVar1 = local_f0.fUnion.fStackFields.fLengthAndFlags;
          uVar4 = uVar7;
        }
        uVar9 = (int)(short)uVar4 >> 5;
LAB_0025218d:
        iVar11 = iVar11 + 1;
        if ((short)uVar4 < 0) {
          uVar9 = local_f0.fUnion.fFields.fLength;
        }
        if (((int)uVar9 < 1) || (local_118.index == 0)) break;
      }
    }
    UnicodeString::operator=(&local_f0,local_b0);
    result = local_a8;
    if (parsePosition->index == 0x7fffffff) {
      uVar6 = local_f0.fUnion.fStackFields.fLengthAndFlags & 0x1e;
      uVar2 = local_f0.fUnion.fStackFields.fLengthAndFlags & 1;
      local_f0.fUnion.fStackFields.fLengthAndFlags = 2;
      if (uVar2 == 0) {
        local_f0.fUnion.fStackFields.fLengthAndFlags = uVar6;
      }
    }
    else {
      UnicodeString::doReplace(&local_f0,0,parsePosition->index,(UChar *)0x0,0,0);
    }
    parsePosition->index = 0;
    Formattable::~Formattable(&local_a0);
    ParsePosition::~ParsePosition(&local_118);
    baseValue_00 = local_100;
    if (this->withZeros != '\0') {
      baseValue_00 = 1.0;
    }
  }
  NFSubstitution::doParse
            (&this->super_NFSubstitution,&local_f0,parsePosition,baseValue_00,local_f8,'\0',
             nonNumericalExecutedRuleMask,result);
  if (this->withZeros != '\0') {
    iVar5 = Formattable::getLong(result,&local_104);
    if (iVar5 < 1) {
      lVar8 = 1;
    }
    else {
      lVar8 = 1;
      do {
        lVar8 = lVar8 * 10;
      } while (lVar8 <= iVar5);
    }
    if (0 < iVar11) {
      uVar4 = iVar11 + 1;
      do {
        lVar8 = lVar8 * 10;
        uVar4 = uVar4 - 1;
      } while (1 < uVar4);
    }
    Formattable::setDouble(result,(double)iVar5 / (double)lVar8);
  }
  UnicodeString::~UnicodeString(&local_f0);
  return '\x01';
}

Assistant:

UBool 
NumeratorSubstitution::doParse(const UnicodeString& text, 
                               ParsePosition& parsePosition,
                               double baseValue,
                               double upperBound,
                               UBool /*lenientParse*/,
                               uint32_t nonNumericalExecutedRuleMask,
                               Formattable& result) const
{
    // we don't have to do anything special to do the parsing here,
    // but we have to turn lenient parsing off-- if we leave it on,
    // it SERIOUSLY messes up the algorithm

    // if withZeros is true, we need to count the zeros
    // and use that to adjust the parse result
    UErrorCode status = U_ZERO_ERROR;
    int32_t zeroCount = 0;
    UnicodeString workText(text);

    if (withZeros) {
        ParsePosition workPos(1);
        Formattable temp;

        while (workText.length() > 0 && workPos.getIndex() != 0) {
            workPos.setIndex(0);
            getRuleSet()->parse(workText, workPos, 1, nonNumericalExecutedRuleMask, temp); // parse zero or nothing at all
            if (workPos.getIndex() == 0) {
                // we failed, either there were no more zeros, or the number was formatted with digits
                // either way, we're done
                break;
            }

            ++zeroCount;
            parsePosition.setIndex(parsePosition.getIndex() + workPos.getIndex());
            workText.remove(0, workPos.getIndex());
            while (workText.length() > 0 && workText.charAt(0) == gSpace) {
                workText.remove(0, 1);
                parsePosition.setIndex(parsePosition.getIndex() + 1);
            }
        }

        workText = text;
        workText.remove(0, (int32_t)parsePosition.getIndex());
        parsePosition.setIndex(0);
    }

    // we've parsed off the zeros, now let's parse the rest from our current position
    NFSubstitution::doParse(workText, parsePosition, withZeros ? 1 : baseValue, upperBound, FALSE, nonNumericalExecutedRuleMask, result);

    if (withZeros) {
        // any base value will do in this case.  is there a way to
        // force this to not bother trying all the base values?

        // compute the 'effective' base and prescale the value down
        int64_t n = result.getLong(status); // force conversion!
        int64_t d = 1;
        int32_t pow = 0;
        while (d <= n) {
            d *= 10;
            ++pow;
        }
        // now add the zeros
        while (zeroCount > 0) {
            d *= 10;
            --zeroCount;
        }
        // d is now our true denominator
        result.setDouble((double)n/(double)d);
    }

    return TRUE;
}